

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O3

void __thiscall soplex::SPxOut::SPxOut(SPxOut *this,SPxOut *rhs)

{
  ostream *poVar1;
  long lVar2;
  
  this->_vptr_SPxOut = (_func_int **)&PTR__SPxOut_006a8c00;
  this->m_verbosity = rhs->m_verbosity;
  this->m_streams = (ostream **)0x0;
  spx_alloc<std::ostream**>(&this->m_streams,6);
  poVar1 = *rhs->m_streams;
  this->m_streams[1] = poVar1;
  *this->m_streams = poVar1;
  lVar2 = 0;
  do {
    this->m_streams[lVar2 + 2] = rhs->m_streams[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

SPxOut::SPxOut(const SPxOut& rhs)
{
   m_verbosity = rhs.m_verbosity;
   m_streams = nullptr;
   spx_alloc(m_streams, INFO3 + 1);
   m_streams = new(m_streams) std::ostream*[INFO3 + 1];
   m_streams[ ERROR ] = m_streams[ WARNING ] = rhs.m_streams[ERROR];

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = rhs.m_streams[ i ];
}